

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_tiled_generic_fp(int count,QT_FT_Span *spans,void *userData)

{
  long lVar1;
  char cVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  undefined1 local_110 [28];
  int iStack_f4;
  QSpanData *local_f0;
  Operator op;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,spans,count);
  if (op.funcFP == (CompositionFunctionFP)0x0) {
    lcQtGuiDrawHelper();
    if (((byte)lcQtGuiDrawHelper::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_110._0_4_ = 2;
      local_110._4_4_ = 0;
      local_110._8_4_ = 0;
      local_110._12_4_ = 0;
      local_110._16_4_ = 0;
      local_110._20_4_ = 0;
      stack0xffffffffffffff08 = lcQtGuiDrawHelper::category.name;
      QMessageLogger::debug
                (local_110,
                 "blend_tiled_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit")
      ;
    }
    blend_tiled_generic(count,spans,userData);
  }
  else {
    local_110._20_4_ = *(int *)((long)userData + 0xb0);
    iVar9 = *(int *)((long)userData + 0xb4);
    iVar6 = (int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                          0x3fe0000000000000) - *(double *)((long)userData + 0x70)) %
            (int)local_110._20_4_;
    iVar7 = (int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                          0x3fe0000000000000) - *(double *)((long)userData + 0x78)) % iVar9;
    local_110._16_4_ = 0;
    if (0 < iVar6) {
      local_110._16_4_ = local_110._20_4_;
    }
    local_110._16_4_ = local_110._16_4_ - iVar6;
    iVar6 = 0;
    if (0 < iVar7) {
      iVar6 = iVar9;
    }
    stack0xffffffffffffff08 = (char *)CONCAT44(iVar9,iVar6 - iVar7);
    uVar8 = (long)(count + 0x20) / 0x40 & 0xffffffff;
    local_f0 = (QSpanData *)userData;
    local_110._0_8_ = &op;
    local_110._8_8_ = spans;
    pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((0x5f < count) && (pQVar3 != (QThreadPool *)0x0)) &&
       (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
      QThread::currentThread();
      cVar2 = QThreadPool::contains((QThread *)pQVar3);
      if (cVar2 == '\0') {
        _semaphore = &DAT_aaaaaaaaaaaaaaaa;
        iVar9 = 0;
        QSemaphore::QSemaphore(&semaphore,0);
        while( true ) {
          iVar6 = (int)uVar8;
          uVar8 = (ulong)(iVar6 - 1);
          if (iVar6 == 0) break;
          iVar6 = (count - iVar9) / iVar6;
          puVar4 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar4 + 1) = 1;
          *puVar4 = QFactoryLoader::keyMap;
          puVar5 = (undefined8 *)operator_new(0x20);
          *puVar5 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4898:5)>
                    ::impl;
          *(int *)(puVar5 + 1) = iVar9;
          *(int *)((long)puVar5 + 0xc) = iVar6;
          puVar5[2] = local_110;
          puVar5[3] = &semaphore;
          puVar4[2] = puVar5;
          QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
          iVar9 = iVar9 + iVar6;
        }
        QSemaphore::acquire((int)&semaphore);
        QSemaphore::~QSemaphore(&semaphore);
        goto LAB_005be7a3;
      }
    }
    blend_tiled_generic_fp::anon_class_40_7_bfeee2df::operator()
              ((anon_class_40_7_bfeee2df *)local_110,0,count);
  }
LAB_005be7a3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_tiled_generic_fp(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);
    if (!op.funcFP) {
        qCDebug(lcQtGuiDrawHelper, "blend_tiled_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit");
        return blend_tiled_generic(count, spans, userData);
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;

    // Consider tiling optimizing like the other versions.

    auto function = [=, &op](int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgbaFloat32 buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED QRgbaFloat32 src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * data->texture.const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const QRgbaFloat32 *src = op.srcFetchFP(src_buffer, &op, data, sy, sx, l);
                QRgbaFloat32 *dest = op.destFetchFP(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcFP(dest, src, l, coverage);
                if (op.destStoreFP)
                    op.destStoreFP(data->rasterBuffer, x, spans[c].y, dest, l);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}